

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jerror.c
# Opt level: O0

void output_message(j_common_ptr cinfo)

{
  long *in_RDI;
  char buffer [200];
  undefined1 auStack_d8 [216];
  
  (**(code **)(*in_RDI + 0x18))(in_RDI,auStack_d8);
  fprintf(_stderr,"%s\n",auStack_d8);
  return;
}

Assistant:

METHODDEF(void)
output_message(j_common_ptr cinfo)
{
  char buffer[JMSG_LENGTH_MAX];

  /* Create the message */
  (*cinfo->err->format_message) (cinfo, buffer);

#ifdef USE_WINDOWS_MESSAGEBOX
  /* Display it in a message dialog box */
  MessageBox(GetActiveWindow(), buffer, "JPEG Library Error",
             MB_OK | MB_ICONERROR);
#else
  /* Send it to stderr, adding a newline */
  fprintf(stderr, "%s\n", buffer);
#endif
}